

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool ON_TuneupEvaluationParameter(int side,double s0,double s1,double *s)

{
  double dVar1;
  double dVar2;
  
  if (((side != 0) && (dVar1 = *s, s0 < dVar1)) && (dVar1 < s1)) {
    dVar2 = (s1 - s0) * 1e-10;
    if (side < 0) {
      s1 = s0;
      if (dVar1 <= dVar2 + s0) goto LAB_0059619a;
    }
    else if (s1 - dVar2 <= dVar1) {
LAB_0059619a:
      *s = s1;
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_TuneupEvaluationParameter( 
   int side,
   double s0, double s1, // segment domain
   double *s             // segment parameter
   )
{
  double t = *s;
  if ( 0 != side && s0 < t && t < s1 )
  {
    // 9 November 2010 Dale Lear
    //   I wrote this function today and chose
    //   1.0e-10 as the "noise" factor.  1.0e-10
    //   may need to be adjusted but it should
    //   not be larger unless there is a very
    //   good reason.  You must document any changes
    //   and include a bug track number so subsequent
    //   changes can be tested.  Any value used to
    //   replace 1.0e-10 must be strictly smaller
    //   than ON_SQRT_EPSILON because some solvers
    //   use (s1-s0)*ON_SQRT_EPSILON as a minimum step
    //   size.
    double ds = (s1-s0)*1.0e-10;
    if ( side < 0 )
    {
      if ( t <= s0+ds )
      {
        *s = s0;
        return true;
      }
    }
    else // side > 0
    {
      if ( t >= s1-ds )
      {
        *s = s1;
        return true;
      }
    }
  }
  return false;
}